

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::
FunctionMocker<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
PerformDefaultAction
          (FunctionMocker<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
           *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_00;
  Result pEVar3;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_01;
  string message;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  _Head_base<0UL,_const_ot::commissioner::Address_&,_false> local_38;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                 *)0x0;
      break;
    }
    this_01 = (OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
               *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    bVar2 = OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
            Matches(this_01,args);
  } while (!bVar2);
  if (this_01 ==
      (OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)0x0)
  {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_58);
    if (DefaultValue<ot::commissioner::EnergyReport_const*>::producer_ == (long *)0x0) {
      pEVar3 = (Result)0x0;
    }
    else {
      pEVar3 = (Result)(**(code **)(*DefaultValue<ot::commissioner::EnergyReport_const*>::producer_
                                   + 0x10))();
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  else {
    this_00 = OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
              ::GetAction(this_01);
    local_38._M_head_impl =
         (args->super__Tuple_impl<0UL,_const_ot::commissioner::Address_&>).
         super__Head_base<0UL,_const_ot::commissioner::Address_&,_false>._M_head_impl;
    pEVar3 = Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
             Perform(this_00,(ArgumentTuple *)&local_38);
  }
  return pEVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }